

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O2

void __thiscall QDial::mouseReleaseEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  int value;
  long in_FS_OFFSET;
  QPointF local_30;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(e + 0x40) == 1) && ((*(uint *)(e + 0x44) & 0xfffffffe) == 0)) {
    this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    e[0xc] = (QMouseEvent)0x1;
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_20 = QPointF::toPoint(&local_30);
    value = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setValue(&this->super_QAbstractSlider,value);
    QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,false);
  }
  else {
    e[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseReleaseEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (e->buttons() & (~e->button()) ||
       (e->button() != Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    setValue(d->valueFromPoint(e->position().toPoint()));
    setSliderDown(false);
}